

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

bool CheckRTL8211F_RegIO(AmpIO *Board,uint chan,uint phyAddr)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  ushort local_2a;
  ushort local_26;
  ushort local_24;
  uint16_t mask;
  bool allOK;
  uint uStack_20;
  uint16_t mask_read;
  uint16_t curIner;
  uint16_t curPage;
  uint phyAddr_local;
  uint chan_local;
  AmpIO *Board_local;
  
  uStack_20 = phyAddr;
  _curIner = chan;
  _phyAddr_local = Board;
  bVar1 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,phyAddr,0x1f,&mask);
  if (bVar1) {
    if (mask != 0xa42) {
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::hex);
      poVar2 = std::operator<<(poVar2,"Changing page from ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,mask);
      poVar2 = std::operator<<(poVar2," to ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,0xa42);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      bVar1 = FpgaIO::WriteRTL8211F_Register
                        (&_phyAddr_local->super_FpgaIO,_curIner,uStack_20,0x1f,0xa42);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Failed to write PHY");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,_curIner);
        poVar2 = std::operator<<(poVar2," PAGSR");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        return false;
      }
    }
    bVar1 = FpgaIO::ReadRTL8211F_Register
                      (&_phyAddr_local->super_FpgaIO,_curIner,uStack_20,0x12,&local_24);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Testing RTL8211F PHY");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,_curIner);
      poVar2 = std::operator<<(poVar2," Register I/O, initial value = ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::hex);
      pvVar3 = (void *)std::ostream::operator<<(pvVar3,local_24);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      Board_local._7_1_ = true;
      for (local_2a = 1; local_2a != 0; local_2a = local_2a << 1) {
        FpgaIO::WriteRTL8211F_Register
                  (&_phyAddr_local->super_FpgaIO,_curIner,uStack_20,0x12,local_2a);
        FpgaIO::ReadRTL8211F_Register
                  (&_phyAddr_local->super_FpgaIO,_curIner,uStack_20,0x12,&local_26);
        if (local_2a != local_26) {
          poVar2 = std::operator<<((ostream *)&std::cout,"Error: wrote ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2a);
          poVar2 = std::operator<<(poVar2,", read ");
          pvVar3 = (void *)std::ostream::operator<<(poVar2,local_26);
          std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
          Board_local._7_1_ = false;
        }
      }
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::dec);
      poVar2 = std::operator<<(poVar2,"Test complete");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      FpgaIO::WriteRTL8211F_Register(&_phyAddr_local->super_FpgaIO,_curIner,uStack_20,0x12,local_24)
      ;
      FpgaIO::WriteRTL8211F_Register(&_phyAddr_local->super_FpgaIO,_curIner,uStack_20,0x1f,mask);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to read PHY");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,_curIner);
      poVar2 = std::operator<<(poVar2," INER");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Board_local._7_1_ = false;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Failed to read PHY");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,_curIner);
    poVar2 = std::operator<<(poVar2," PAGSR");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Board_local._7_1_ = false;
  }
  return Board_local._7_1_;
}

Assistant:

bool CheckRTL8211F_RegIO(AmpIO &Board, unsigned int chan, unsigned int phyAddr)
{
    uint16_t curPage;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, curPage)) {
        std::cout << "Failed to read PHY" << chan << " PAGSR" << std::endl;
        return false;
    }
    if (curPage != FpgaIO::RTL8211F_PAGE_DEFAULT) {
        std::cout << std::hex << "Changing page from " << curPage << " to " << FpgaIO::RTL8211F_PAGE_DEFAULT << std::endl;
        if (!Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, FpgaIO::RTL8211F_PAGE_DEFAULT)) {
            std::cout << "Failed to write PHY" << chan << " PAGSR" << std::endl;
            return false;
        }
    }
    // Perform walking bit test on INER (interrupt enable register, 18)
    uint16_t curIner, mask_read;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_INER, curIner)) {
        std::cout << "Failed to read PHY" << chan << " INER" << std::endl;
        return false;
    }
    std::cout << "Testing RTL8211F PHY" << chan << " Register I/O, initial value = " << std::hex << curIner << std::endl;
    bool allOK = true;
    for (uint16_t mask = 0x1; mask != 0; mask <<= 1) {
        Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_INER, mask);
        Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_INER, mask_read);
        if (mask != mask_read) {
            std::cout << "Error: wrote " << mask << ", read " << mask_read << std::endl;
            allOK = false;
            //break;
        }
    }
    std::cout << std::dec << "Test complete" << std::endl;
    // Restore original values
    Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_INER, curIner);
    Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, curPage);
    return allOK;
}